

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFPrimitiveReader.cpp
# Opt level: O1

void __thiscall
CFFPrimitiveReader::SetStream(CFFPrimitiveReader *this,IByteReaderWithPosition *inCFFFile)

{
  int iVar1;
  EStatusCode EVar2;
  undefined4 extraout_var;
  
  this->mCFFFile = inCFFFile;
  if (inCFFFile == (IByteReaderWithPosition *)0x0) {
    EVar2 = eFailure;
  }
  else {
    this->mCurrentOffsize = '\x01';
    iVar1 = (*(inCFFFile->super_IByteReader)._vptr_IByteReader[6])(inCFFFile);
    this->mInitialPosition = CONCAT44(extraout_var,iVar1);
    EVar2 = eSuccess;
  }
  this->mInternalState = EVar2;
  return;
}

Assistant:

void CFFPrimitiveReader::SetStream(IByteReaderWithPosition* inCFFFile)
{
	mCFFFile = inCFFFile;
	if(inCFFFile)
	{
		mCurrentOffsize = 1;
		mInitialPosition = inCFFFile->GetCurrentPosition();
		mInternalState = PDFHummus::eSuccess;
	}
	else
	{
		mInternalState = PDFHummus::eFailure;
	}
}